

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

L2NormalizeLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::L2NormalizeLayerParams>
          (Arena *arena)

{
  L2NormalizeLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (L2NormalizeLayerParams *)operator_new(0x18);
    CoreML::Specification::L2NormalizeLayerParams::L2NormalizeLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (L2NormalizeLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x18,
                      (type_info *)&CoreML::Specification::L2NormalizeLayerParams::typeinfo);
    CoreML::Specification::L2NormalizeLayerParams::L2NormalizeLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }